

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

void mg_close_connection(mg_connection *conn)

{
  if ((conn != (mg_connection *)0x0) && (conn->phys_ctx != (mg_context *)0x0)) {
    close_connection(conn);
    if (conn->phys_ctx->context_type == 2) {
      pthread_mutex_destroy((pthread_mutex_t *)&conn->mutex);
      free(conn);
      return;
    }
  }
  return;
}

Assistant:

CIVETWEB_API void
mg_close_connection(struct mg_connection *conn)
{
	if ((conn == NULL) || (conn->phys_ctx == NULL)) {
		return;
	}

#if defined(USE_WEBSOCKET)
	if (conn->phys_ctx->context_type == CONTEXT_SERVER) {
		if (conn->in_websocket_handling) {
			/* Set close flag, so the server thread can exit. */
			conn->must_close = 1;
			return;
		}
	}
	if (conn->phys_ctx->context_type == CONTEXT_WS_CLIENT) {

		unsigned int i;

		/* client context: loops must end */
		STOP_FLAG_ASSIGN(&conn->phys_ctx->stop_flag, 1);
		conn->must_close = 1;

		/* We need to get the client thread out of the select/recv call
		 * here. */
		/* Since we use a sleep quantum of some seconds to check for recv
		 * timeouts, we will just wait a few seconds in mg_join_thread. */

		/* join worker thread */
		for (i = 0; i < conn->phys_ctx->cfg_worker_threads; i++) {
			mg_join_thread(conn->phys_ctx->worker_threadids[i]);
		}
	}
#endif /* defined(USE_WEBSOCKET) */

	close_connection(conn);

#if !defined(NO_SSL) && !defined(USE_MBEDTLS) // TODO: mbedTLS client
	if (((conn->phys_ctx->context_type == CONTEXT_HTTP_CLIENT)
	     || (conn->phys_ctx->context_type == CONTEXT_WS_CLIENT))
	    && (conn->phys_ctx->dd.ssl_ctx != NULL)) {
		SSL_CTX_free(conn->phys_ctx->dd.ssl_ctx);
	}
#endif

#if defined(USE_WEBSOCKET)
	if (conn->phys_ctx->context_type == CONTEXT_WS_CLIENT) {
		mg_free(conn->phys_ctx->worker_threadids);
		(void)pthread_mutex_destroy(&conn->mutex);
		mg_free(conn);
	} else if (conn->phys_ctx->context_type == CONTEXT_HTTP_CLIENT) {
		(void)pthread_mutex_destroy(&conn->mutex);
		mg_free(conn);
	}
#else
	if (conn->phys_ctx->context_type == CONTEXT_HTTP_CLIENT) { /* Client */
		(void)pthread_mutex_destroy(&conn->mutex);
		mg_free(conn);
	}
#endif /* defined(USE_WEBSOCKET) */
}